

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::initShaderSources
          (ShaderTextureFunctionCase *this)

{
  bool bVar1;
  bool bVar2;
  Function FVar3;
  CompareMode CVar4;
  TextureType TVar5;
  DataType DVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  TextureFormat format;
  char *pcVar10;
  ostream *poVar11;
  ostringstream *poVar12;
  uint uVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ostringstream *this_00;
  char *lodBias;
  char *local_348;
  string local_340 [32];
  ostringstream vert;
  ostringstream frag;
  
  FVar3 = (this->m_lookupSpec).function;
  CVar4 = (this->m_textureSpec).sampler.compare;
  TVar5 = (this->m_textureSpec).type;
  if (CVar4 == COMPAREMODE_NONE && TVar5 == TEXTURETYPE_2D) {
    iVar16 = 2;
    if ((FVar3 != FUNCTION_TEXTUREPROJ) && (FVar3 != FUNCTION_TEXTUREPROJLOD)) {
      iVar16 = (FVar3 == FUNCTION_TEXTUREPROJGRAD) + 1;
    }
  }
  else {
    iVar16 = 1;
  }
  bVar1 = (this->super_ShaderRenderCase).m_isVertexCase;
  bVar2 = (this->m_lookupSpec).useBias;
  iVar15 = 0;
  if (((byte)(0x1b6 >> ((byte)FVar3 & 0x1f)) & FVar3 < FUNCTION_TEXELFETCH) != 0) {
    iVar15 = iVar16;
  }
  iVar16 = iVar15 + ((uint)(CVar4 != COMPAREMODE_NONE) - (uint)(TVar5 == TEXTURETYPE_2D)) + 3;
  DVar6 = glu::getDataTypeFloatVec(iVar16);
  pcVar8 = glu::getDataTypeName(DVar6);
  pcVar9 = glu::getPrecisionName(PRECISION_HIGHP);
  format = glu::mapGLInternalFormat((this->m_textureSpec).format);
  pcVar10 = glu::getDataTypeName
                      (((this->m_textureSpec).type & ~TEXTURETYPE_2D_ARRAY) == TEXTURETYPE_CUBE_MAP
                       | TYPE_FLOAT_VEC2);
  switch((this->m_textureSpec).type) {
  case TEXTURETYPE_2D:
    if (CVar4 == COMPAREMODE_NONE) {
      DVar6 = glu::getSampler2DType(format);
    }
    else {
      DVar6 = TYPE_SAMPLER_2D_SHADOW;
    }
    break;
  case TEXTURETYPE_CUBE_MAP:
    if (CVar4 == COMPAREMODE_NONE) {
      DVar6 = glu::getSamplerCubeType(format);
    }
    else {
      DVar6 = TYPE_SAMPLER_CUBE_SHADOW;
    }
    break;
  case TEXTURETYPE_2D_ARRAY:
    if (CVar4 == COMPAREMODE_NONE) {
      DVar6 = glu::getSampler2DArrayType(format);
    }
    else {
      DVar6 = TYPE_SAMPLER_2D_ARRAY_SHADOW;
    }
    break;
  case TEXTURETYPE_3D:
    DVar6 = glu::getSampler3DType(format);
    break;
  default:
    DVar6 = TYPE_LAST;
  }
  uVar17 = (ulong)(this->m_lookupSpec).function;
  if (uVar17 < 10) {
    local_348 = &DAT_01845df8 + *(int *)(&DAT_01845df8 + uVar17 * 4);
  }
  else {
    local_348 = (char *)0x0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vert);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  this_00 = (ostringstream *)&frag;
  if (bVar1 != false) {
    this_00 = (ostringstream *)&vert;
  }
  poVar11 = std::operator<<((ostream *)&vert,"#version 300 es\n");
  poVar11 = std::operator<<(poVar11,"in highp vec4 a_position;\n");
  poVar11 = std::operator<<(poVar11,"in ");
  poVar11 = std::operator<<(poVar11,pcVar9);
  poVar11 = std::operator<<(poVar11," ");
  poVar11 = std::operator<<(poVar11,pcVar8);
  std::operator<<(poVar11," a_in0;\n");
  uVar7 = FVar3 - FUNCTION_TEXTUREGRAD;
  if (uVar7 < 3) {
    poVar11 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"in ");
    poVar11 = std::operator<<(poVar11,pcVar9);
    poVar11 = std::operator<<(poVar11," ");
    poVar11 = std::operator<<(poVar11,pcVar10);
    std::operator<<(poVar11," a_in1;\n");
    poVar11 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"in ");
    poVar11 = std::operator<<(poVar11,pcVar9);
    poVar11 = std::operator<<(poVar11," ");
    poVar11 = std::operator<<(poVar11,pcVar10);
    pcVar14 = " a_in2;\n";
LAB_00fe7bdf:
    std::operator<<(poVar11,pcVar14);
  }
  else if (((bVar2 & 1U) != 0) || ((FVar3 < FUNCTION_LAST && ((0x238U >> (FVar3 & 0x1f) & 1) != 0)))
          ) {
    poVar11 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"in ");
    poVar11 = std::operator<<(poVar11,pcVar9);
    pcVar14 = " float a_in1;\n";
    goto LAB_00fe7bdf;
  }
  poVar12 = &frag;
  poVar11 = std::operator<<(&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,
                            "#version 300 es\n");
  std::operator<<(poVar11,"layout(location = 0) out mediump vec4 o_color;\n");
  if (bVar1 == false) {
    poVar11 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"out ");
    poVar11 = std::operator<<(poVar11,pcVar9);
    poVar11 = std::operator<<(poVar11," ");
    poVar11 = std::operator<<(poVar11,pcVar8);
    std::operator<<(poVar11," v_texCoord;\n");
    poVar11 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"in ");
    poVar11 = std::operator<<(poVar11,pcVar9);
    poVar11 = std::operator<<(poVar11," ");
    poVar11 = std::operator<<(poVar11,pcVar8);
    std::operator<<(poVar11," v_texCoord;\n");
    if (uVar7 < 3) {
      poVar11 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"out ");
      poVar11 = std::operator<<(poVar11,pcVar9);
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = std::operator<<(poVar11,pcVar10);
      std::operator<<(poVar11," v_gradX;\n");
      poVar11 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"out ");
      poVar11 = std::operator<<(poVar11,pcVar9);
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = std::operator<<(poVar11,pcVar10);
      std::operator<<(poVar11," v_gradY;\n");
      poVar11 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"in ");
      poVar11 = std::operator<<(poVar11,pcVar9);
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = std::operator<<(poVar11,pcVar10);
      std::operator<<(poVar11," v_gradX;\n");
      poVar11 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"in ");
      poVar11 = std::operator<<(poVar11,pcVar9);
      poVar11 = std::operator<<(poVar11," ");
      poVar11 = std::operator<<(poVar11,pcVar10);
      std::operator<<(poVar11," v_gradY;\n");
    }
    if (((bVar2 & 1U) != 0) || ((FVar3 < FUNCTION_LAST && ((0x238U >> (FVar3 & 0x1f) & 1) != 0)))) {
      poVar11 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"out ");
      poVar11 = std::operator<<(poVar11,pcVar9);
      pcVar8 = " float v_lodBias;\n";
      std::operator<<(poVar11," float v_lodBias;\n");
      poVar11 = std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"in ");
      poVar12 = (ostringstream *)std::operator<<(poVar11,pcVar9);
      goto LAB_00fe7e50;
    }
  }
  else {
    std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,
                    "out mediump vec4 v_color;\n");
    pcVar8 = "in mediump vec4 v_color;\n";
LAB_00fe7e50:
    std::operator<<(&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,pcVar8);
  }
  poVar11 = std::operator<<((ostream *)this_00,"uniform highp ");
  pcVar8 = glu::getDataTypeName(DVar6);
  poVar11 = std::operator<<(poVar11,pcVar8);
  poVar11 = std::operator<<(poVar11," u_sampler;\n");
  poVar11 = std::operator<<(poVar11,"uniform highp vec4 u_scale;\n");
  std::operator<<(poVar11,"uniform highp vec4 u_bias;\n");
  poVar11 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,
                            "\nvoid main()\n{\n");
  std::operator<<(poVar11,"\tgl_Position = a_position;\n");
  poVar12 = &frag;
  std::operator<<(&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,"\nvoid main()\n{\n")
  ;
  if (bVar1 == false) {
    std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\to_color = ");
    pcVar8 = "v_texCoord";
    pcVar9 = "v_gradX";
    pcVar10 = "v_gradY";
    lodBias = "v_lodBias";
  }
  else {
    std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"\tv_color = ");
    pcVar8 = "a_in0";
    pcVar10 = "a_in2";
    pcVar9 = "a_in1";
    lodBias = "a_in1";
  }
  poVar11 = std::operator<<((ostream *)this_00,"vec4(");
  std::operator<<(poVar11,local_348);
  if ((this->m_lookupSpec).useOffset == true) {
    std::operator<<((ostream *)this_00,"Offset");
  }
  std::operator<<((ostream *)this_00,"(u_sampler, ");
  if (FVar3 == FUNCTION_TEXELFETCH) {
    poVar11 = std::operator<<((ostream *)this_00,"ivec");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar16);
    std::operator<<(poVar11,"(");
  }
  std::operator<<((ostream *)this_00,pcVar8);
  if (FVar3 == FUNCTION_TEXELFETCH) {
    std::operator<<((ostream *)this_00,")");
    poVar11 = std::operator<<((ostream *)this_00,", int(");
    poVar11 = std::operator<<(poVar11,lodBias);
    pcVar8 = ")";
LAB_00fe8060:
    std::operator<<(poVar11,pcVar8);
  }
  else {
    if (uVar7 < 3) {
      poVar11 = std::operator<<((ostream *)this_00,", ");
      poVar11 = std::operator<<(poVar11,pcVar9);
      poVar11 = std::operator<<(poVar11,", ");
      std::operator<<(poVar11,pcVar10);
    }
    if (FVar3 - FUNCTION_TEXTURELOD < 3) {
      poVar11 = std::operator<<((ostream *)this_00,", ");
      pcVar8 = lodBias;
      goto LAB_00fe8060;
    }
  }
  if ((this->m_lookupSpec).useOffset == true) {
    TVar5 = (this->m_textureSpec).type;
    poVar11 = std::operator<<((ostream *)this_00,", ivec");
    uVar13 = TVar5 == TEXTURETYPE_3D | 2;
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar13);
    std::operator<<(poVar11,"(");
    for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
      if (uVar17 != 0) {
        std::operator<<((ostream *)this_00,", ");
      }
      std::ostream::operator<<(this_00,(this->m_lookupSpec).offset.m_data[uVar17]);
    }
    std::operator<<((ostream *)this_00,")");
  }
  if ((this->m_lookupSpec).useBias == true) {
    poVar11 = std::operator<<((ostream *)this_00,", ");
    std::operator<<(poVar11,lodBias);
  }
  std::operator<<((ostream *)this_00,")");
  pcVar8 = ")*u_scale + u_bias";
  if (CVar4 != COMPAREMODE_NONE) {
    pcVar8 = ", 0.0, 0.0, 1.0)";
  }
  std::operator<<((ostream *)this_00,pcVar8);
  std::operator<<((ostream *)this_00,";\n");
  if (bVar1 == false) {
    poVar12 = &vert;
    std::operator<<(&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tv_texCoord = a_in0;\n");
    if (uVar7 < 3) {
      poVar12 = &vert;
      std::operator<<(&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tv_gradX = a_in1;\n");
      pcVar8 = "\tv_gradY = a_in2;\n";
    }
    else {
      pcVar8 = "\tv_lodBias = a_in1;\n";
      if (((bVar2 & 1U) == 0) &&
         ((FUNCTION_TEXELFETCH < FVar3 || ((0x238U >> (FVar3 & 0x1f) & 1) == 0))))
      goto LAB_00fe81ce;
    }
  }
  else {
    pcVar8 = "\to_color = v_color;\n";
  }
  std::operator<<(&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,pcVar8);
LAB_00fe81ce:
  std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_340);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_340);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vert);
  return;
}

Assistant:

void ShaderTextureFunctionCase::initShaderSources (void)
{
	Function			function			= m_lookupSpec.function;
	bool				isVtxCase			= m_isVertexCase;
	bool				isProj				= functionHasProj(function);
	bool				isGrad				= functionHasGrad(function);
	bool				isShadow			= m_textureSpec.sampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	bool				is2DProj4			= !isShadow && m_textureSpec.type == TEXTURETYPE_2D && (function == FUNCTION_TEXTUREPROJ || function == FUNCTION_TEXTUREPROJLOD || function == FUNCTION_TEXTUREPROJGRAD);
	bool				isIntCoord			= function == FUNCTION_TEXELFETCH;
	bool				hasLodBias			= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	int					texCoordComps		= m_textureSpec.type == TEXTURETYPE_2D ? 2 : 3;
	int					extraCoordComps		= (isProj ? (is2DProj4 ? 2 : 1) : 0) + (isShadow ? 1 : 0);
	glu::DataType		coordType			= glu::getDataTypeFloatVec(texCoordComps+extraCoordComps);
	glu::Precision		coordPrec			= glu::PRECISION_HIGHP;
	const char*			coordTypeName		= glu::getDataTypeName(coordType);
	const char*			coordPrecName		= glu::getPrecisionName(coordPrec);
	tcu::TextureFormat	texFmt				= glu::mapGLInternalFormat(m_textureSpec.format);
	glu::DataType		samplerType			= glu::TYPE_LAST;
	glu::DataType		gradType			= (m_textureSpec.type == TEXTURETYPE_CUBE_MAP || m_textureSpec.type == TEXTURETYPE_3D) ? glu::TYPE_FLOAT_VEC3 : glu::TYPE_FLOAT_VEC2;
	const char*			gradTypeName		= glu::getDataTypeName(gradType);
	const char*			baseFuncName		= DE_NULL;

	DE_ASSERT(!isGrad || !hasLodBias);

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:		samplerType = isShadow ? glu::TYPE_SAMPLER_2D_SHADOW		: glu::getSampler2DType(texFmt);		break;
		case TEXTURETYPE_CUBE_MAP:	samplerType = isShadow ? glu::TYPE_SAMPLER_CUBE_SHADOW		: glu::getSamplerCubeType(texFmt);		break;
		case TEXTURETYPE_2D_ARRAY:	samplerType = isShadow ? glu::TYPE_SAMPLER_2D_ARRAY_SHADOW	: glu::getSampler2DArrayType(texFmt);	break;
		case TEXTURETYPE_3D:		DE_ASSERT(!isShadow); samplerType = glu::getSampler3DType(texFmt);									break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (m_lookupSpec.function)
	{
		case FUNCTION_TEXTURE:			baseFuncName = "texture";			break;
		case FUNCTION_TEXTUREPROJ:		baseFuncName = "textureProj";		break;
		case FUNCTION_TEXTUREPROJ3:		baseFuncName = "textureProj";		break;
		case FUNCTION_TEXTURELOD:		baseFuncName = "textureLod";		break;
		case FUNCTION_TEXTUREPROJLOD:	baseFuncName = "textureProjLod";	break;
		case FUNCTION_TEXTUREPROJLOD3:	baseFuncName = "textureProjLod";	break;
		case FUNCTION_TEXTUREGRAD:		baseFuncName = "textureGrad";		break;
		case FUNCTION_TEXTUREPROJGRAD:	baseFuncName = "textureProjGrad";	break;
		case FUNCTION_TEXTUREPROJGRAD3:	baseFuncName = "textureProjGrad";	break;
		case FUNCTION_TEXELFETCH:		baseFuncName = "texelFetch";		break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	std::ostringstream	vert;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVtxCase ? vert : frag;

	vert << "#version 300 es\n"
		 << "in highp vec4 a_position;\n"
		 << "in " << coordPrecName << " " << coordTypeName << " a_in0;\n";

	if (isGrad)
	{
		vert << "in " << coordPrecName << " " << gradTypeName << " a_in1;\n";
		vert << "in " << coordPrecName << " " << gradTypeName << " a_in2;\n";
	}
	else if (hasLodBias)
		vert << "in " << coordPrecName << " float a_in1;\n";

	frag << "#version 300 es\n"
		 << "layout(location = 0) out mediump vec4 o_color;\n";

	if (isVtxCase)
	{
		vert << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		vert << "out " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";
		frag << "in " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";

		if (isGrad)
		{
			vert << "out " << coordPrecName << " " << gradTypeName << " v_gradX;\n";
			vert << "out " << coordPrecName << " " << gradTypeName << " v_gradY;\n";
			frag << "in " << coordPrecName << " " << gradTypeName << " v_gradX;\n";
			frag << "in " << coordPrecName << " " << gradTypeName << " v_gradY;\n";
		}

		if (hasLodBias)
		{
			vert << "out " << coordPrecName << " float v_lodBias;\n";
			frag << "in " << coordPrecName << " float v_lodBias;\n";
		}
	}

	// Uniforms
	op << "uniform highp " << glu::getDataTypeName(samplerType) << " u_sampler;\n"
	   << "uniform highp vec4 u_scale;\n"
	   << "uniform highp vec4 u_bias;\n";

	vert << "\nvoid main()\n{\n"
		 << "\tgl_Position = a_position;\n";
	frag << "\nvoid main()\n{\n";

	if (isVtxCase)
		vert << "\tv_color = ";
	else
		frag << "\to_color = ";

	// Op.
	{
		const char*	texCoord	= isVtxCase ? "a_in0" : "v_texCoord";
		const char* gradX		= isVtxCase ? "a_in1" : "v_gradX";
		const char* gradY		= isVtxCase ? "a_in2" : "v_gradY";
		const char*	lodBias		= isVtxCase ? "a_in1" : "v_lodBias";

		op << "vec4(" << baseFuncName;
		if (m_lookupSpec.useOffset)
			op << "Offset";
		op << "(u_sampler, ";

		if (isIntCoord)
			op << "ivec" << (texCoordComps+extraCoordComps) << "(";

		op << texCoord;

		if (isIntCoord)
			op << ")";

		if (isGrad)
			op << ", " << gradX << ", " << gradY;

		if (functionHasLod(function))
		{
			if (isIntCoord)
				op << ", int(" << lodBias << ")";
			else
				op << ", " << lodBias;
		}

		if (m_lookupSpec.useOffset)
		{
			int offsetComps = m_textureSpec.type == TEXTURETYPE_3D ? 3 : 2;

			op << ", ivec" << offsetComps << "(";
			for (int ndx = 0; ndx < offsetComps; ndx++)
			{
				if (ndx != 0)
					op << ", ";
				op << m_lookupSpec.offset[ndx];
			}
			op << ")";
		}

		if (m_lookupSpec.useBias)
			op << ", " << lodBias;

		op << ")";

		if (isShadow)
			op << ", 0.0, 0.0, 1.0)";
		else
			op << ")*u_scale + u_bias";

		op << ";\n";
	}

	if (isVtxCase)
		frag << "\to_color = v_color;\n";
	else
	{
		vert << "\tv_texCoord = a_in0;\n";

		if (isGrad)
		{
			vert << "\tv_gradX = a_in1;\n";
			vert << "\tv_gradY = a_in2;\n";
		}
		else if (hasLodBias)
			vert << "\tv_lodBias = a_in1;\n";
	}

	vert << "}\n";
	frag << "}\n";

	m_vertShaderSource = vert.str();
	m_fragShaderSource = frag.str();
}